

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mipmapped_texture::print_crn_comp_params(mipmapped_texture *this,crn_comp_params *p)

{
  bool bVar1;
  char *pcVar2;
  crn_comp_params *in_RSI;
  
  console::debug("CRN compression params:");
  pcVar2 = crn_get_file_type_ext(in_RSI->m_file_type);
  console::debug("      File Type: %s",pcVar2);
  console::debug("  Quality level: %u",(ulong)in_RSI->m_quality_level);
  console::debug((char *)(double)in_RSI->m_target_bitrate," Target Bitrate: %f");
  console::debug("          Faces: %u",(ulong)in_RSI->m_faces);
  console::debug("          Width: %u",(ulong)in_RSI->m_width);
  console::debug("         Height: %u",(ulong)in_RSI->m_height);
  console::debug("         Levels: %u",(ulong)in_RSI->m_levels);
  pcVar2 = crn_get_format_string(0x1739b8);
  console::debug("   Pixel Format: %s",pcVar2);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagManualPaletteSizes);
  console::debug("Use manual CRN palette sizes: %u",(ulong)bVar1);
  console::debug("Color endpoints: %u",(ulong)in_RSI->m_crn_color_endpoint_palette_size);
  console::debug("Color selectors: %u",(ulong)in_RSI->m_crn_color_selector_palette_size);
  console::debug("Alpha endpoints: %u",(ulong)in_RSI->m_crn_alpha_endpoint_palette_size);
  console::debug("Alpha selectors: %u",(ulong)in_RSI->m_crn_alpha_selector_palette_size);
  console::debug("Flags:");
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagPerceptual);
  console::debug("    Perceptual: %u",(ulong)bVar1);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagHierarchical);
  console::debug("  Hierarchical: %u",(ulong)bVar1);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagUseBothBlockTypes);
  console::debug("  UseBothBlockTypes: %u",(ulong)bVar1);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagUseTransparentIndicesForBlack);
  console::debug("  UseTransparentIndicesForBlack: %u",(ulong)bVar1);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagDisableEndpointCaching);
  console::debug("  DisableEndpointCaching: %u",(ulong)bVar1);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagGrayscaleSampling);
  console::debug("GrayscaleSampling: %u",(ulong)bVar1);
  bVar1 = crn_comp_params::get_flag(in_RSI,cCRNCompFlagDXT1AForTransparency);
  console::debug("  UseDXT1ATransparency: %u",(ulong)bVar1);
  console::debug((char *)(double)in_RSI->m_crn_adaptive_tile_color_psnr_derating,
                 "AdaptiveTileColorPSNRDerating: %2.2fdB");
  console::debug((char *)(double)in_RSI->m_crn_adaptive_tile_alpha_psnr_derating,
                 "AdaptiveTileAlphaPSNRDerating: %2.2fdB");
  console::debug("NumHelperThreads: %u",(ulong)in_RSI->m_num_helper_threads);
  return;
}

Assistant:

void mipmapped_texture::print_crn_comp_params(const crn_comp_params& p) {
  console::debug("CRN compression params:");
  console::debug("      File Type: %s", crn_get_file_type_ext(p.m_file_type));
  console::debug("  Quality level: %u", p.m_quality_level);
  console::debug(" Target Bitrate: %f", p.m_target_bitrate);
  console::debug("          Faces: %u", p.m_faces);
  console::debug("          Width: %u", p.m_width);
  console::debug("         Height: %u", p.m_height);
  console::debug("         Levels: %u", p.m_levels);
  console::debug("   Pixel Format: %s", crn_get_format_string(p.m_format));
  console::debug("Use manual CRN palette sizes: %u", p.get_flag(cCRNCompFlagManualPaletteSizes));
  console::debug("Color endpoints: %u", p.m_crn_color_endpoint_palette_size);
  console::debug("Color selectors: %u", p.m_crn_color_selector_palette_size);
  console::debug("Alpha endpoints: %u", p.m_crn_alpha_endpoint_palette_size);
  console::debug("Alpha selectors: %u", p.m_crn_alpha_selector_palette_size);
  console::debug("Flags:");
  console::debug("    Perceptual: %u", p.get_flag(cCRNCompFlagPerceptual));
  console::debug("  Hierarchical: %u", p.get_flag(cCRNCompFlagHierarchical));
  console::debug("  UseBothBlockTypes: %u", p.get_flag(cCRNCompFlagUseBothBlockTypes));
  console::debug("  UseTransparentIndicesForBlack: %u", p.get_flag(cCRNCompFlagUseTransparentIndicesForBlack));
  console::debug("  DisableEndpointCaching: %u", p.get_flag(cCRNCompFlagDisableEndpointCaching));
  console::debug("GrayscaleSampling: %u", p.get_flag(cCRNCompFlagGrayscaleSampling));
  console::debug("  UseDXT1ATransparency: %u", p.get_flag(cCRNCompFlagDXT1AForTransparency));
  console::debug("AdaptiveTileColorPSNRDerating: %2.2fdB", p.m_crn_adaptive_tile_color_psnr_derating);
  console::debug("AdaptiveTileAlphaPSNRDerating: %2.2fdB", p.m_crn_adaptive_tile_alpha_psnr_derating);
  console::debug("NumHelperThreads: %u", p.m_num_helper_threads);
}